

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

OPJ_BOOL opj_event_msg(opj_event_mgr_t *p_event_mgr,OPJ_INT32 event_type,char *fmt,...)

{
  char local_258 [8];
  char message [512];
  va_list arg;
  void *local_38;
  void *l_data;
  opj_msg_callback msg_handler;
  char *fmt_local;
  OPJ_INT32 event_type_local;
  opj_event_mgr_t *p_event_mgr_local;
  
  l_data = (void *)0x0;
  local_38 = (void *)0x0;
  if (p_event_mgr == (opj_event_mgr_t *)0x0) {
    p_event_mgr_local._4_4_ = 0;
  }
  else {
    if (event_type == 1) {
      l_data = p_event_mgr->error_handler;
      local_38 = p_event_mgr->m_error_data;
    }
    else if (event_type == 2) {
      l_data = p_event_mgr->warning_handler;
      local_38 = p_event_mgr->m_warning_data;
    }
    else if (event_type == 4) {
      l_data = p_event_mgr->info_handler;
      local_38 = p_event_mgr->m_info_data;
    }
    if (l_data == (void *)0x0) {
      p_event_mgr_local._4_4_ = 0;
    }
    else {
      if ((fmt != (char *)0x0) && (p_event_mgr != (opj_event_mgr_t *)0x0)) {
        memset(local_258,0,0x200);
        message[0x1fc] = '0';
        message[0x1fd] = '\0';
        message[0x1fe] = '\0';
        message[0x1ff] = '\0';
        message[0x1f8] = '\x18';
        message[0x1f9] = '\0';
        message[0x1fa] = '\0';
        message[0x1fb] = '\0';
        vsnprintf(local_258,0x200,fmt,message + 0x1f8);
        message[0x1f7] = '\0';
        (*(code *)l_data)(local_258,local_38);
      }
      p_event_mgr_local._4_4_ = 1;
    }
  }
  return p_event_mgr_local._4_4_;
}

Assistant:

OPJ_BOOL opj_event_msg(opj_event_mgr_t* p_event_mgr, OPJ_INT32 event_type,
                       const char *fmt, ...)
{
#define OPJ_MSG_SIZE 512 /* 512 bytes should be more than enough for a short message */
    opj_msg_callback msg_handler = 00;
    void * l_data = 00;

    if (p_event_mgr != 00) {
        switch (event_type) {
        case EVT_ERROR:
            msg_handler = p_event_mgr->error_handler;
            l_data = p_event_mgr->m_error_data;
            break;
        case EVT_WARNING:
            msg_handler = p_event_mgr->warning_handler;
            l_data = p_event_mgr->m_warning_data;
            break;
        case EVT_INFO:
            msg_handler = p_event_mgr->info_handler;
            l_data = p_event_mgr->m_info_data;
            break;
        default:
            break;
        }
        if (msg_handler == 00) {
            return OPJ_FALSE;
        }
    } else {
        return OPJ_FALSE;
    }

    if ((fmt != 00) && (p_event_mgr != 00)) {
        va_list arg;
        char message[OPJ_MSG_SIZE];
        memset(message, 0, OPJ_MSG_SIZE);
        /* initialize the optional parameter list */
        va_start(arg, fmt);
        /* parse the format string and put the result in 'message' */
        vsnprintf(message, OPJ_MSG_SIZE, fmt, arg);
        /* force zero termination for Windows _vsnprintf() of old MSVC */
        message[OPJ_MSG_SIZE - 1] = '\0';
        /* deinitialize the optional parameter list */
        va_end(arg);

        /* output the message to the user program */
        msg_handler(message, l_data);
    }

    return OPJ_TRUE;
}